

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Alice *pAVar1;
  code *local_40;
  undefined8 local_38;
  int local_2c;
  Alice *local_28;
  Alice *A;
  thread server_thread;
  
  pAVar1 = (Alice *)operator_new(0x150);
  Alice::Alice(pAVar1);
  local_40 = Alice::GoLive;
  local_38 = 0;
  local_2c = 0x4bc;
  local_28 = pAVar1;
  std::thread::thread<int(Alice::*)(int),Alice*&,int,void>
            ((thread *)&A,(type *)&local_40,&local_28,&local_2c);
  std::thread::join();
  pAVar1 = local_28;
  if (local_28 != (Alice *)0x0) {
    Alice::~Alice(local_28);
  }
  operator_delete(pAVar1,0x150);
  std::thread::~thread((thread *)&A);
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) 
{ 
	Alice *A = new Alice();;
	std::thread server_thread(&Alice::GoLive, A, PORT);
	server_thread.join();
	delete A;
	return 0; 
}